

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::init_frame(jpeg_decoder *this)

{
  uint8 *puVar1;
  jpgd_block_coeff_t *pjVar2;
  int local_14;
  int i;
  jpeg_decoder *this_local;
  
  if (this->m_comps_in_frame == 1) {
    if ((this->m_comp_h_samp[0] != 1) || (this->m_comp_v_samp[0] != 1)) {
      stop_decoding(this,JPGD_UNSUPPORTED_SAMP_FACTORS);
    }
    this->m_scan_type = 0;
    this->m_max_blocks_per_mcu = 1;
    this->m_max_mcu_x_size = 8;
    this->m_max_mcu_y_size = 8;
  }
  else {
    if (this->m_comps_in_frame != 3) {
      stop_decoding(this,JPGD_UNSUPPORTED_COLORSPACE);
    }
    if ((((this->m_comp_h_samp[1] != 1) || (this->m_comp_v_samp[1] != 1)) ||
        (this->m_comp_h_samp[2] != 1)) || (this->m_comp_v_samp[2] != 1)) {
      stop_decoding(this,JPGD_UNSUPPORTED_SAMP_FACTORS);
    }
    if ((this->m_comp_h_samp[0] == 1) && (this->m_comp_v_samp[0] == 1)) {
      this->m_scan_type = 1;
      this->m_max_blocks_per_mcu = 3;
      this->m_max_mcu_x_size = 8;
      this->m_max_mcu_y_size = 8;
    }
    else if ((this->m_comp_h_samp[0] == 2) && (this->m_comp_v_samp[0] == 1)) {
      this->m_scan_type = 2;
      this->m_max_blocks_per_mcu = 4;
      this->m_max_mcu_x_size = 0x10;
      this->m_max_mcu_y_size = 8;
    }
    else if ((this->m_comp_h_samp[0] == 1) && (this->m_comp_v_samp[0] == 2)) {
      this->m_scan_type = 3;
      this->m_max_blocks_per_mcu = 4;
      this->m_max_mcu_x_size = 8;
      this->m_max_mcu_y_size = 0x10;
    }
    else {
      if ((this->m_comp_h_samp[0] != 2) || (this->m_comp_v_samp[0] != 2)) {
        stop_decoding(this,JPGD_UNSUPPORTED_SAMP_FACTORS);
      }
      this->m_scan_type = 4;
      this->m_max_blocks_per_mcu = 6;
      this->m_max_mcu_x_size = 0x10;
      this->m_max_mcu_y_size = 0x10;
    }
  }
  this->m_max_mcus_per_row =
       (this->m_image_x_size + this->m_max_mcu_x_size + -1) / this->m_max_mcu_x_size;
  this->m_max_mcus_per_col =
       (this->m_image_y_size + this->m_max_mcu_y_size + -1) / this->m_max_mcu_y_size;
  if (this->m_scan_type == 0) {
    this->m_dest_bytes_per_pixel = 1;
  }
  else {
    this->m_dest_bytes_per_pixel = 4;
  }
  this->m_dest_bytes_per_scan_line =
       (this->m_image_x_size + 0xfU & 0xfff0) * this->m_dest_bytes_per_pixel;
  this->m_real_dest_bytes_per_scan_line = this->m_image_x_size * this->m_dest_bytes_per_pixel;
  puVar1 = (uint8 *)alloc_aligned(this,(long)this->m_dest_bytes_per_scan_line,1,false);
  this->m_pScan_line_0 = puVar1;
  if ((this->m_scan_type == 3) || (this->m_scan_type == 4)) {
    puVar1 = (uint8 *)alloc_aligned(this,(long)this->m_dest_bytes_per_scan_line,1,false);
    this->m_pScan_line_1 = puVar1;
  }
  this->m_max_blocks_per_row = this->m_max_mcus_per_row * this->m_max_blocks_per_mcu;
  if (this->m_max_blocks_per_row < 0x4001) {
    pjVar2 = (jpgd_block_coeff_t *)
             alloc_aligned(this,(long)(this->m_max_blocks_per_mcu << 6) << 1,0x10,false);
    this->m_pMCU_coefficients = pjVar2;
    for (local_14 = 0; local_14 < this->m_max_blocks_per_mcu; local_14 = local_14 + 1) {
      this->m_mcu_block_max_zag[local_14] = 0x40;
    }
    puVar1 = (uint8 *)alloc_aligned(this,(long)(this->m_max_blocks_per_row << 6),0x10,false);
    this->m_pSample_buf = puVar1;
    puVar1 = (uint8 *)alloc_aligned(this,(long)(this->m_max_blocks_per_row << 6),0x10,false);
    this->m_pSample_buf_prev = puVar1;
    this->m_total_lines_left = this->m_image_y_size;
    this->m_mcu_lines_left = 0;
    create_look_ups(this);
    return;
  }
  stop_decoding(this,JPGD_DECODE_ERROR);
}

Assistant:

void jpeg_decoder::init_frame()
	{
		int i;

		if (m_comps_in_frame == 1)
		{
			if ((m_comp_h_samp[0] != 1) || (m_comp_v_samp[0] != 1))
				stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);

			m_scan_type = JPGD_GRAYSCALE;
			m_max_blocks_per_mcu = 1;
			m_max_mcu_x_size = 8;
			m_max_mcu_y_size = 8;
		}
		else if (m_comps_in_frame == 3)
		{
			if (((m_comp_h_samp[1] != 1) || (m_comp_v_samp[1] != 1)) ||
				((m_comp_h_samp[2] != 1) || (m_comp_v_samp[2] != 1)))
				stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);

			if ((m_comp_h_samp[0] == 1) && (m_comp_v_samp[0] == 1))
			{
				m_scan_type = JPGD_YH1V1;

				m_max_blocks_per_mcu = 3;
				m_max_mcu_x_size = 8;
				m_max_mcu_y_size = 8;
			}
			else if ((m_comp_h_samp[0] == 2) && (m_comp_v_samp[0] == 1))
			{
				m_scan_type = JPGD_YH2V1;
				m_max_blocks_per_mcu = 4;
				m_max_mcu_x_size = 16;
				m_max_mcu_y_size = 8;
			}
			else if ((m_comp_h_samp[0] == 1) && (m_comp_v_samp[0] == 2))
			{
				m_scan_type = JPGD_YH1V2;
				m_max_blocks_per_mcu = 4;
				m_max_mcu_x_size = 8;
				m_max_mcu_y_size = 16;
			}
			else if ((m_comp_h_samp[0] == 2) && (m_comp_v_samp[0] == 2))
			{
				m_scan_type = JPGD_YH2V2;
				m_max_blocks_per_mcu = 6;
				m_max_mcu_x_size = 16;
				m_max_mcu_y_size = 16;
			}
			else
				stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);
		}
		else
			stop_decoding(JPGD_UNSUPPORTED_COLORSPACE);

		m_max_mcus_per_row = (m_image_x_size + (m_max_mcu_x_size - 1)) / m_max_mcu_x_size;
		m_max_mcus_per_col = (m_image_y_size + (m_max_mcu_y_size - 1)) / m_max_mcu_y_size;

		// These values are for the *destination* pixels: after conversion.
		if (m_scan_type == JPGD_GRAYSCALE)
			m_dest_bytes_per_pixel = 1;
		else
			m_dest_bytes_per_pixel = 4;

		m_dest_bytes_per_scan_line = ((m_image_x_size + 15) & 0xFFF0) * m_dest_bytes_per_pixel;

		m_real_dest_bytes_per_scan_line = (m_image_x_size * m_dest_bytes_per_pixel);

		// Initialize two scan line buffers.
		m_pScan_line_0 = (uint8*)alloc_aligned(m_dest_bytes_per_scan_line, true);
		if ((m_scan_type == JPGD_YH1V2) || (m_scan_type == JPGD_YH2V2))
			m_pScan_line_1 = (uint8*)alloc_aligned(m_dest_bytes_per_scan_line, true);

		m_max_blocks_per_row = m_max_mcus_per_row * m_max_blocks_per_mcu;

		// Should never happen
		if (m_max_blocks_per_row > JPGD_MAX_BLOCKS_PER_ROW)
			stop_decoding(JPGD_DECODE_ERROR);

		// Allocate the coefficient buffer, enough for one MCU
		m_pMCU_coefficients = (jpgd_block_coeff_t *)alloc_aligned(m_max_blocks_per_mcu * 64 * sizeof(jpgd_block_coeff_t));
				
		for (i = 0; i < m_max_blocks_per_mcu; i++)
			m_mcu_block_max_zag[i] = 64;

		m_pSample_buf = (uint8*)alloc_aligned(m_max_blocks_per_row * 64);
		m_pSample_buf_prev = (uint8*)alloc_aligned(m_max_blocks_per_row * 64);

		m_total_lines_left = m_image_y_size;

		m_mcu_lines_left = 0;

		create_look_ups();
	}